

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryMaterialsLoader15.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryMaterialsLoader15::begin__instance_effect(LibraryMaterialsLoader15 *this)

{
  instance_effect__AttributeData *in_RSI;
  
  begin__instance_effect
            ((LibraryMaterialsLoader15 *)&this[-1].super_IParserImpl15.super_ColladaParserAutoGen15,
             in_RSI);
  return;
}

Assistant:

bool LibraryMaterialsLoader15::begin__instance_effect( const COLLADASaxFWL15::instance_effect__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_effect(attributeData));
COLLADASaxFWL::instance_effect__AttributeData attrData;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_effect__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_effect__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_effect__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_effect(attrData);
}